

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  HighsInt *pHVar1;
  HighsInt HVar2;
  int iVar3;
  HighsInt HVar4;
  int *piVar5;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
  _Var6;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
  __comp;
  bool bVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  undefined4 in_register_0000000c;
  uint uVar9;
  ulong uVar10;
  _DistanceType __len;
  ulong uVar11;
  long lVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  HighsInt *pHVar14;
  undefined7 in_register_00000081;
  ulong uVar15;
  HighsInt *pHVar16;
  HighsInt *pHVar17;
  HighsInt *pHVar18;
  long lVar19;
  anon_class_8_1_8991fb9c local_90;
  HighsInt *local_88;
  uint local_7c;
  ulong local_78;
  HighsInt *local_70;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
  local_68;
  ulong local_60;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
  local_58;
  int *local_50;
  long local_48;
  long local_40;
  HighsInt *local_38;
  
  local_60 = CONCAT44(in_register_0000000c,bad_allowed);
  local_7c = (uint)CONCAT71(in_register_00000081,leftmost);
  local_50 = end._M_current + -1;
  local_88 = end._M_current;
  local_68._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)comp.this;
  do {
    _Var6._M_comp.this = local_68._M_comp.this;
    pHVar14 = local_88;
    uVar11 = (long)local_88 - (long)begin._M_current;
    pHVar18 = (HighsInt *)((long)uVar11 >> 2);
    if ((long)pHVar18 < 0x18) {
      pHVar18 = begin._M_current + 1;
      if ((local_7c & 1) == 0) {
        local_90 = local_68._M_comp.this;
        _Var13._M_current = begin._M_current;
        if (pHVar18 != local_88 && begin._M_current != local_88) {
          do {
            pHVar16 = pHVar18;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,_Var13._M_current[1],*_Var13._M_current);
            if (bVar7) {
              HVar2 = *pHVar16;
              pHVar18 = pHVar16;
              do {
                pHVar17 = pHVar18 + -2;
                *pHVar18 = pHVar18[-1];
                pHVar18 = pHVar18 + -1;
                bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                  (&local_90,HVar2,*pHVar17);
              } while (bVar7);
              *pHVar18 = HVar2;
            }
            pHVar18 = pHVar16 + 1;
            _Var13._M_current = pHVar16;
          } while (pHVar16 + 1 != pHVar14);
        }
        bVar7 = true;
      }
      else {
        local_90 = local_68._M_comp.this;
        if (pHVar18 != local_88 && begin._M_current != local_88) {
          lVar19 = 4;
          _Var13._M_current = begin._M_current;
          do {
            pHVar16 = pHVar18;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,_Var13._M_current[1],*_Var13._M_current);
            if (bVar7) {
              HVar2 = *pHVar16;
              lVar12 = lVar19;
              do {
                *(undefined4 *)((long)begin._M_current + lVar12) =
                     *(undefined4 *)((long)begin._M_current + lVar12 + -4);
                _Var13._M_current = begin._M_current;
                if (lVar12 == 4) goto LAB_002dd279;
                bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                  (&local_90,HVar2,
                                   *(HighsInt *)((long)begin._M_current + lVar12 + -8));
                lVar12 = lVar12 + -4;
              } while (bVar7);
              _Var13._M_current = (HighsInt *)(lVar12 + (long)begin._M_current);
LAB_002dd279:
              *_Var13._M_current = HVar2;
            }
            lVar19 = lVar19 + 4;
            pHVar18 = pHVar16 + 1;
            _Var13._M_current = pHVar16;
          } while (pHVar16 + 1 != pHVar14);
        }
LAB_002dd28c:
        bVar7 = true;
      }
    }
    else {
      uVar15 = (ulong)pHVar18 >> 1;
      if ((long)pHVar18 < 0x81) {
        local_90 = local_68._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,*begin._M_current,begin._M_current[uVar15]);
        if (bVar7) {
          iVar3 = begin._M_current[uVar15];
          begin._M_current[uVar15] = *begin._M_current;
          *begin._M_current = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,local_88[-1],*begin._M_current);
        if (bVar7) {
          HVar2 = *begin._M_current;
          *begin._M_current = local_88[-1];
          local_88[-1] = HVar2;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,*begin._M_current,begin._M_current[uVar15]);
        if (bVar7) {
          iVar3 = begin._M_current[uVar15];
          begin._M_current[uVar15] = *begin._M_current;
          *begin._M_current = iVar3;
        }
      }
      else {
        local_90 = local_68._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15],*begin._M_current);
        if (bVar7) {
          iVar3 = *begin._M_current;
          *begin._M_current = begin._M_current[uVar15];
          begin._M_current[uVar15] = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,local_88[-1],begin._M_current[uVar15]);
        if (bVar7) {
          HVar2 = begin._M_current[uVar15];
          begin._M_current[uVar15] = local_88[-1];
          local_88[-1] = HVar2;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15],*begin._M_current);
        if (bVar7) {
          iVar3 = *begin._M_current;
          *begin._M_current = begin._M_current[uVar15];
          begin._M_current[uVar15] = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15 - 1],begin._M_current[1]);
        if (bVar7) {
          iVar3 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar15 - 1];
          begin._M_current[uVar15 - 1] = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,local_88[-2],begin._M_current[uVar15 - 1]);
        if (bVar7) {
          HVar2 = begin._M_current[uVar15 - 1];
          begin._M_current[uVar15 - 1] = local_88[-2];
          local_88[-2] = HVar2;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15 - 1],begin._M_current[1]);
        if (bVar7) {
          iVar3 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar15 - 1];
          begin._M_current[uVar15 - 1] = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15 + 1],begin._M_current[2]);
        if (bVar7) {
          iVar3 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar15 + 1];
          begin._M_current[uVar15 + 1] = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,local_88[-3],begin._M_current[uVar15 + 1]);
        if (bVar7) {
          HVar2 = begin._M_current[uVar15 + 1];
          begin._M_current[uVar15 + 1] = local_88[-3];
          local_88[-3] = HVar2;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15 + 1],begin._M_current[2]);
        if (bVar7) {
          iVar3 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar15 + 1];
          begin._M_current[uVar15 + 1] = iVar3;
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15],begin._M_current[uVar15 - 1]);
        if (bVar7) {
          *(ulong *)(begin._M_current + (uVar15 - 1)) =
               CONCAT44((int)*(undefined8 *)(begin._M_current + (uVar15 - 1)),
                        (int)((ulong)*(undefined8 *)(begin._M_current + (uVar15 - 1)) >> 0x20));
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15 + 1],begin._M_current[uVar15]);
        if (bVar7) {
          *(ulong *)(begin._M_current + uVar15) =
               CONCAT44((int)*(undefined8 *)(begin._M_current + uVar15),
                        (int)((ulong)*(undefined8 *)(begin._M_current + uVar15) >> 0x20));
        }
        local_90 = _Var6._M_comp.this;
        bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          (&local_90,begin._M_current[uVar15],begin._M_current[uVar15 - 1]);
        if (bVar7) {
          *(ulong *)(begin._M_current + (uVar15 - 1)) =
               CONCAT44((int)*(undefined8 *)(begin._M_current + (uVar15 - 1)),
                        (int)((ulong)*(undefined8 *)(begin._M_current + (uVar15 - 1)) >> 0x20));
        }
        iVar3 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar15];
        begin._M_current[uVar15] = iVar3;
      }
      pHVar14 = local_88;
      if (((local_7c & 1) != 0) ||
         (bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_68._M_comp,begin._M_current[-1],*begin._M_current), bVar7)) {
        _Var6._M_comp.this = local_68._M_comp.this;
        local_90 = local_68._M_comp.this;
        HVar2 = *begin._M_current;
        lVar12 = 4;
        lVar19 = 0;
        local_78 = uVar11;
        local_70 = pHVar18;
        do {
          bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_90,*(HighsInt *)((long)begin._M_current + lVar12),HVar2);
          lVar19 = lVar19 + -4;
          lVar12 = lVar12 + 4;
        } while (bVar7);
        pHVar18 = (HighsInt *)((long)begin._M_current - lVar19);
        if (lVar19 == -4) {
          do {
            if (pHVar14 <= pHVar18) break;
            pHVar16 = pHVar14 + -1;
            pHVar14 = pHVar14 + -1;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,*pHVar16,HVar2);
          } while (!bVar7);
        }
        else {
          do {
            pHVar16 = pHVar14 + -1;
            pHVar14 = pHVar14 + -1;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,*pHVar16,HVar2);
          } while (!bVar7);
        }
        local_58._M_comp.this = _Var6._M_comp.this;
        pHVar16 = pHVar18;
        pHVar17 = pHVar14;
        if (pHVar18 < pHVar14) {
          do {
            HVar4 = *pHVar16;
            *pHVar16 = *pHVar17;
            *pHVar17 = HVar4;
            do {
              _Var13._M_current = pHVar16;
              pHVar16 = _Var13._M_current + 1;
              bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                (&local_90,_Var13._M_current[1],HVar2);
            } while (bVar7);
            do {
              pHVar1 = pHVar17 + -1;
              pHVar17 = pHVar17 + -1;
              bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                (&local_90,*pHVar1,HVar2);
            } while (!bVar7);
          } while (pHVar16 < pHVar17);
        }
        else {
          _Var13._M_current = pHVar18 + -1;
        }
        _Var6._M_comp.this = local_58._M_comp.this;
        pHVar17 = local_70;
        *begin._M_current = *_Var13._M_current;
        *_Var13._M_current = HVar2;
        uVar15 = (long)_Var13._M_current - (long)begin._M_current >> 2;
        pHVar16 = _Var13._M_current + 1;
        uVar11 = (long)local_88 - (long)pHVar16 >> 2;
        if (((long)uVar15 < (long)((ulong)local_70 >> 3)) ||
           ((long)uVar11 < (long)((ulong)local_70 >> 3))) {
          uVar9 = (int)local_60 - 1;
          local_60 = (ulong)uVar9;
          if (uVar9 == 0) {
            lVar19 = (long)local_70 + (-2 - ((long)local_70 + -2 >> 0x3f)) >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::setupIntCols()::__0>>
                        (begin,lVar19,(long)pHVar17,begin._M_current[lVar19],_Var6);
              __comp._M_comp.this = local_68._M_comp.this;
              bVar7 = lVar19 != 0;
              lVar19 = lVar19 + -1;
              uVar11 = local_78;
              piVar5 = local_50;
            } while (bVar7);
            while (4 < (long)uVar11) {
              iVar3 = *piVar5;
              *piVar5 = *begin._M_current;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::setupIntCols()::__0>>
                        (begin,0,(long)(uVar11 - 4) >> 2,iVar3,__comp);
              uVar11 = uVar11 - 4;
              piVar5 = piVar5 + -1;
            }
            local_60 = 0;
            goto LAB_002dd28c;
          }
          if (0x17 < (long)uVar15) {
            uVar10 = uVar15 & 0xfffffffffffffffc;
            iVar3 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar10);
            *(begin._M_current + uVar10) = iVar3;
            iVar3 = _Var13._M_current[-1];
            _Var13._M_current[-1] = *(_Var13._M_current - uVar10);
            *(_Var13._M_current - uVar10) = iVar3;
            if (0x80 < (long)uVar15) {
              uVar15 = uVar15 >> 2;
              iVar3 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar15 + 1];
              begin._M_current[uVar15 + 1] = iVar3;
              iVar3 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar15 + 2];
              begin._M_current[uVar15 + 2] = iVar3;
              iVar3 = _Var13._M_current[-2];
              _Var13._M_current[-2] = _Var13._M_current[~uVar15];
              _Var13._M_current[~uVar15] = iVar3;
              iVar3 = _Var13._M_current[-3];
              _Var13._M_current[-3] = _Var13._M_current[-2 - uVar15];
              _Var13._M_current[-2 - uVar15] = iVar3;
            }
          }
          if (0x17 < (long)uVar11) {
            iVar3 = _Var13._M_current[1];
            uVar15 = uVar11 & 0xfffffffffffffffc;
            _Var13._M_current[1] = *(uVar15 + 4 + _Var13._M_current);
            *(uVar15 + 4 + _Var13._M_current) = iVar3;
            HVar2 = local_88[-1];
            local_88[-1] = *(HighsInt *)((long)local_88 - uVar15);
            *(HighsInt *)((long)local_88 - uVar15) = HVar2;
            if (0x80 < (long)uVar11) {
              uVar11 = uVar11 >> 2;
              iVar3 = _Var13._M_current[2];
              _Var13._M_current[2] = _Var13._M_current[uVar11 + 2];
              _Var13._M_current[uVar11 + 2] = iVar3;
              iVar3 = _Var13._M_current[3];
              _Var13._M_current[3] = _Var13._M_current[uVar11 + 3];
              _Var13._M_current[uVar11 + 3] = iVar3;
              HVar2 = local_88[-2];
              local_88[-2] = local_88[~uVar11];
              local_88[~uVar11] = HVar2;
              HVar2 = local_88[-3];
              local_88[-3] = local_88[-2 - uVar11];
              local_88[-2 - uVar11] = HVar2;
            }
          }
        }
        else if (pHVar14 <= pHVar18) {
          local_90 = local_58._M_comp.this;
          if (begin._M_current == _Var13._M_current) {
LAB_002dd9fd:
            local_90 = local_58._M_comp.this;
            if (pHVar16 == local_88) goto LAB_002dd28c;
            pHVar14 = _Var13._M_current + 2;
            lVar19 = 4;
            lVar12 = 0;
            uVar11 = 0;
            do {
              local_70 = (HighsInt *)((long)_Var13._M_current + lVar19 + 4);
              if (local_70 == local_88) goto LAB_002dd28c;
              local_78 = uVar11;
              bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                (&local_90,*(HighsInt *)((long)_Var13._M_current + lVar19 + 4),
                                 *(HighsInt *)((long)_Var13._M_current + lVar19));
              uVar11 = local_78;
              if (bVar7) {
                HVar2 = *local_70;
                local_48 = lVar12;
                local_40 = lVar19;
                local_38 = pHVar14;
                do {
                  *pHVar14 = pHVar14[-1];
                  pHVar18 = pHVar16;
                  if (lVar12 == 0) break;
                  bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                    (&local_90,HVar2,pHVar14[-2]);
                  pHVar18 = pHVar14 + -1;
                  lVar12 = lVar12 + 4;
                  pHVar14 = pHVar18;
                } while (bVar7);
                *pHVar18 = HVar2;
                uVar11 = local_78 + ((long)local_70 - (long)pHVar18 >> 2);
                lVar19 = local_40;
                lVar12 = local_48;
                pHVar14 = local_38;
              }
              lVar19 = lVar19 + 4;
              pHVar14 = pHVar14 + 1;
              lVar12 = lVar12 + -4;
            } while (uVar11 < 9);
          }
          else {
            pHVar14 = (HighsInt *)0x4;
            uVar11 = 0;
            _Var8._M_current = begin._M_current;
            do {
              pHVar18 = _Var8._M_current + 1;
              if (pHVar18 == _Var13._M_current) goto LAB_002dd9fd;
              bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                (&local_90,_Var8._M_current[1],*_Var8._M_current);
              if (bVar7) {
                HVar2 = *pHVar18;
                local_78 = uVar11;
                local_70 = pHVar14;
                do {
                  *(undefined4 *)((long)begin._M_current + (long)pHVar14) =
                       *(undefined4 *)((long)(begin._M_current + -1) + (long)pHVar14);
                  _Var8._M_current = begin._M_current;
                  if (pHVar14 == (HighsInt *)0x4) goto LAB_002dd7a3;
                  bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                    (&local_90,HVar2,
                                     *(HighsInt *)((long)(begin._M_current + -2) + (long)pHVar14));
                  pHVar14 = pHVar14 + -1;
                } while (bVar7);
                _Var8._M_current = (HighsInt *)((long)pHVar14 + (long)begin._M_current);
LAB_002dd7a3:
                *_Var8._M_current = HVar2;
                uVar11 = local_78 + ((long)pHVar18 - (long)_Var8._M_current >> 2);
                pHVar14 = local_70;
              }
              pHVar14 = pHVar14 + 1;
              _Var8._M_current = pHVar18;
            } while (uVar11 < 9);
          }
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
                  (begin,_Var13,local_58._M_comp,(int)local_60,(bool)((byte)local_7c & 1));
        bVar7 = false;
        local_7c = 0;
        begin._M_current = pHVar16;
      }
      else {
        local_90 = local_68._M_comp.this;
        HVar2 = *begin._M_current;
        lVar19 = 0;
        do {
          bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            (&local_90,HVar2,*(HighsInt *)((long)pHVar14 + lVar19 + -4));
          lVar19 = lVar19 + -4;
        } while (bVar7);
        pHVar14 = (HighsInt *)((long)pHVar14 + lVar19);
        _Var13._M_current = begin._M_current;
        if (lVar19 == -4) {
          do {
            if (pHVar14 <= _Var13._M_current) break;
            pHVar18 = _Var13._M_current + 1;
            _Var13._M_current = _Var13._M_current + 1;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,HVar2,*pHVar18);
          } while (!bVar7);
        }
        else {
          do {
            pHVar18 = _Var13._M_current + 1;
            _Var13._M_current = _Var13._M_current + 1;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,HVar2,*pHVar18);
          } while (!bVar7);
        }
        while (_Var13._M_current < pHVar14) {
          HVar4 = *_Var13._M_current;
          *_Var13._M_current = *pHVar14;
          *pHVar14 = HVar4;
          do {
            pHVar18 = pHVar14 + -1;
            pHVar14 = pHVar14 + -1;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,HVar2,*pHVar18);
          } while (bVar7);
          do {
            pHVar18 = _Var13._M_current + 1;
            _Var13._M_current = _Var13._M_current + 1;
            bVar7 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              (&local_90,HVar2,*pHVar18);
          } while (!bVar7);
        }
        *begin._M_current = *pHVar14;
        *pHVar14 = HVar2;
        begin._M_current = pHVar14 + 1;
        bVar7 = false;
      }
    }
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }